

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O1

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_0> *lhs,long depth,long rows,
            long stride,long offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long k;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  
  if (stride != 0 || offset != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x6b0,
                  "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 0>, 4, 2, 0>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 0>, Pack1 = 4, Pack2 = 2, StorageOrder = 0, Conjugate = false, PanelMode = false]"
                 );
  }
  uVar8 = rows + 3;
  if (-1 < rows) {
    uVar8 = rows;
  }
  if (rows < 4) {
    lVar7 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    lVar7 = 0;
    do {
      if (0 < depth) {
        lVar6 = 0;
        do {
          lVar10 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride * lVar6;
          pdVar5 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
          pdVar9 = pdVar5 + lVar10 + uVar4;
          dVar1 = pdVar9[1];
          pdVar5 = pdVar5 + lVar10 + (uVar4 | 2);
          dVar2 = *pdVar5;
          dVar3 = pdVar5[1];
          blockA[lVar7] = *pdVar9;
          (blockA + lVar7)[1] = dVar1;
          blockA[lVar7 + 2] = dVar2;
          (blockA + lVar7 + 2)[1] = dVar3;
          lVar7 = lVar7 + 4;
          lVar6 = lVar6 + 1;
        } while (depth != lVar6);
      }
      uVar4 = uVar4 + 4;
    } while ((long)uVar4 < (long)(uVar8 & 0xfffffffffffffffc));
  }
  for (; (long)uVar4 < (long)(rows - (rows >> 0x3f) & 0xfffffffffffffffeU); uVar4 = uVar4 + 2) {
    if (0 < depth) {
      lVar6 = 0;
      do {
        pdVar9 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                 (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride * lVar6 + uVar4;
        dVar1 = pdVar9[1];
        blockA[lVar7] = *pdVar9;
        (blockA + lVar7)[1] = dVar1;
        lVar7 = lVar7 + 2;
        lVar6 = lVar6 + 1;
      } while (depth != lVar6);
    }
  }
  if ((long)uVar4 < rows) {
    lVar6 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
    pdVar9 = (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + uVar4;
    do {
      pdVar5 = pdVar9;
      lVar10 = depth;
      if (0 < depth) {
        do {
          blockA[lVar7] = *pdVar5;
          lVar7 = lVar7 + 1;
          pdVar5 = pdVar5 + lVar6;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      uVar4 = uVar4 + 1;
      pdVar9 = pdVar9 + 1;
    } while (uVar4 != rows);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  eigen_assert( ((Pack1%PacketSize)==0 && Pack1<=4*PacketSize) || (Pack1<=4) );
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

  const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
  const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
  const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;
  const Index peeled_mc0 = Pack2>=1*PacketSize ? peeled_mc1
                         : Pack2>1             ? (rows/Pack2)*Pack2 : 0;

  Index i=0;

  // Pack 3 packets
  if(Pack1>=3*PacketSize)
  {
    for(; i<peeled_mc3; i+=3*PacketSize)
    {
      if(PanelMode) count += (3*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A, B, C;
        A = lhs.loadPacket(i+0*PacketSize, k);
        B = lhs.loadPacket(i+1*PacketSize, k);
        C = lhs.loadPacket(i+2*PacketSize, k);
        pstore(blockA+count, cj.pconj(A)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(B)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(C)); count+=PacketSize;
      }
      if(PanelMode) count += (3*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack 2 packets
  if(Pack1>=2*PacketSize)
  {
    for(; i<peeled_mc2; i+=2*PacketSize)
    {
      if(PanelMode) count += (2*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A, B;
        A = lhs.loadPacket(i+0*PacketSize, k);
        B = lhs.loadPacket(i+1*PacketSize, k);
        pstore(blockA+count, cj.pconj(A)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(B)); count+=PacketSize;
      }
      if(PanelMode) count += (2*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack 1 packets
  if(Pack1>=1*PacketSize)
  {
    for(; i<peeled_mc1; i+=1*PacketSize)
    {
      if(PanelMode) count += (1*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A;
        A = lhs.loadPacket(i+0*PacketSize, k);
        pstore(blockA+count, cj.pconj(A));
        count+=PacketSize;
      }
      if(PanelMode) count += (1*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack scalars
  if(Pack2<PacketSize && Pack2>1)
  {
    for(; i<peeled_mc0; i+=Pack2)
    {
      if(PanelMode) count += Pack2 * offset;

      for(Index k=0; k<depth; k++)
        for(Index w=0; w<Pack2; w++)
          blockA[count++] = cj(lhs(i+w, k));

      if(PanelMode) count += Pack2 * (stride-offset-depth);
    }
  }
  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}